

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Delete
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,bool a_bRemoveEmpty)

{
  bool bVar1;
  iterator __position;
  iterator __position_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Self __tmp;
  key_type local_48;
  
  if (a_pSection == (char *)0x0) {
    return false;
  }
  local_48.pComment = (char *)0x0;
  local_48.nOrder = 0;
  local_48.pItem = a_pSection;
  __position = std::
               _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
               ::find(&(this->m_data)._M_t,&local_48);
  if ((_Rb_tree_header *)__position._M_node == &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
LAB_0017e895:
    bVar1 = false;
  }
  else {
    if (a_pKey == (char *)0x0) {
      for (p_Var3 = __position._M_node[2]._M_left; p_Var3 != __position._M_node + 2;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        DeleteString(this,*(char **)(p_Var3 + 1));
        DeleteString(this,(char *)p_Var3[1]._M_right);
      }
    }
    else {
      local_48.pComment = (char *)0x0;
      local_48.nOrder = 0;
      local_48.pItem = a_pKey;
      __position_00 =
           std::
           _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
           ::find((_Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                   *)&__position._M_node[1]._M_right,&local_48);
      if (__position_00._M_node == __position._M_node + 2) goto LAB_0017e895;
      do {
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
        DeleteString(this,*(char **)(__position_00._M_node + 1));
        DeleteString(this,(char *)__position_00._M_node[1]._M_right);
        std::
        _Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>
        ::erase_abi_cxx11_((_Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>
                            *)&__position._M_node[1]._M_right,__position_00);
        if (p_Var2 == __position._M_node + 2) break;
        bVar1 = SI_GenericNoCase<char>::operator()
                          ((SI_GenericNoCase<char> *)
                           &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                            IsLess(char_const*,char_const*)::isLess,a_pKey,*(char **)(p_Var2 + 1));
        __position_00._M_node = p_Var2;
      } while (!bVar1);
      if (!a_bRemoveEmpty) {
        return true;
      }
      if (*(long *)(__position._M_node + 3) != 0) {
        return true;
      }
    }
    DeleteString(this,*(char **)(__position._M_node + 1));
    std::
    _Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>>
    ::erase_abi_cxx11_((_Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>>
                        *)&this->m_data,__position);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::Delete(const SI_CHAR *a_pSection, const SI_CHAR *a_pKey,
																bool a_bRemoveEmpty) {
	if (!a_pSection) {
		return false;
	}

	typename TSection::iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		return false;
	}

	// remove a single key if we have a keyname
	if (a_pKey) {
		typename TKeyVal::iterator iKeyVal = iSection->second.find(a_pKey);
		if (iKeyVal == iSection->second.end()) {
			return false;
		}

		// remove any copied strings and then the key
		typename TKeyVal::iterator iDelete;
		do {
			iDelete = iKeyVal++;

			DeleteString(iDelete->first.pItem);
			DeleteString(iDelete->second);
			iSection->second.erase(iDelete);
		} while (iKeyVal != iSection->second.end() && !IsLess(a_pKey, iKeyVal->first.pItem));

		// done now if the section is not empty or we are not pruning away
		// the empty sections. Otherwise let it fall through into the section
		// deletion code
		if (!a_bRemoveEmpty || !iSection->second.empty()) {
			return true;
		}
	} else {
		// delete all copied strings from this section. The actual
		// entries will be removed when the section is removed.
		typename TKeyVal::iterator iKeyVal = iSection->second.begin();
		for (; iKeyVal != iSection->second.end(); ++iKeyVal) {
			DeleteString(iKeyVal->first.pItem);
			DeleteString(iKeyVal->second);
		}
	}

	// delete the section itself
	DeleteString(iSection->first.pItem);
	m_data.erase(iSection);

	return true;
}